

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

FuncDef * sqlite3FindFunction(sqlite3 *db,char *zName,int nName,int nArg,u8 enc,u8 createFlag)

{
  bool bVar1;
  int iVar2;
  FuncDef *pFVar3;
  FuncDef *pDef;
  int iVar4;
  int iVar5;
  
  iVar4 = (int)((uint)""[(byte)*zName] + nName) % 0x17;
  pFVar3 = functionSearch(&db->aFunc,iVar4,zName,nName);
  iVar5 = 0;
  pDef = (FuncDef *)0x0;
  for (; pFVar3 != (FuncDef *)0x0; pFVar3 = pFVar3->pNext) {
    iVar2 = matchQuality(pFVar3,nArg,enc);
    if (iVar5 < iVar2) {
      pDef = pFVar3;
      iVar5 = iVar2;
    }
  }
  if (createFlag == '\0') {
    if ((pDef != (FuncDef *)0x0) && ((db->flags & 0x100000) == 0)) {
      bVar1 = false;
      goto LAB_00120dfc;
    }
    pFVar3 = functionSearch(&sqlite3GlobalFunctions,iVar4,zName,nName);
    iVar5 = 0;
    for (; pFVar3 != (FuncDef *)0x0; pFVar3 = pFVar3->pNext) {
      iVar4 = matchQuality(pFVar3,nArg,enc);
      if (iVar5 < iVar4) {
        pDef = pFVar3;
        iVar5 = iVar4;
      }
    }
  }
  bVar1 = createFlag != '\0';
  if ((createFlag == '\0') || (5 < iVar5)) {
    if (pDef == (FuncDef *)0x0) {
      return (FuncDef *)0x0;
    }
  }
  else {
    pDef = (FuncDef *)sqlite3DbMallocZero(db,nName + 0x49);
    if (pDef == (FuncDef *)0x0) {
      return (FuncDef *)0x0;
    }
    pDef->zName = (char *)(pDef + 1);
    pDef->nArg = (i16)nArg;
    pDef->iPrefEnc = enc;
    memcpy(pDef + 1,zName,(long)nName);
    *(undefined1 *)((long)&pDef[1].nArg + (long)nName) = 0;
    sqlite3FuncDefInsert(&db->aFunc,pDef);
    bVar1 = true;
  }
LAB_00120dfc:
  if (pDef->xStep != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
    return pDef;
  }
  if (!bVar1 && pDef->xFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
    return (FuncDef *)0x0;
  }
  return pDef;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FindFunction(
  sqlite3 *db,       /* An open database */
  const char *zName, /* Name of the function.  Not null-terminated */
  int nName,         /* Number of characters in the name */
  int nArg,          /* Number of arguments.  -1 means any number */
  u8 enc,            /* Preferred text encoding */
  u8 createFlag      /* Create new entry if true and does not otherwise exist */
){
  FuncDef *p;         /* Iterator variable */
  FuncDef *pBest = 0; /* Best match found so far */
  int bestScore = 0;  /* Score of best match */
  int h;              /* Hash value */

  assert( nArg>=(-2) );
  assert( nArg>=(-1) || createFlag==0 );
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  h = (sqlite3UpperToLower[(u8)zName[0]] + nName) % ArraySize(db->aFunc.a);

  /* First search for a match amongst the application-defined functions.
  */
  p = functionSearch(&db->aFunc, h, zName, nName);
  while( p ){
    int score = matchQuality(p, nArg, enc);
    if( score>bestScore ){
      pBest = p;
      bestScore = score;
    }
    p = p->pNext;
  }

  /* If no match is found, search the built-in functions.
  **
  ** If the SQLITE_PreferBuiltin flag is set, then search the built-in
  ** functions even if a prior app-defined function was found.  And give
  ** priority to built-in functions.
  **
  ** Except, if createFlag is true, that means that we are trying to
  ** install a new function.  Whatever FuncDef structure is returned it will
  ** have fields overwritten with new information appropriate for the
  ** new function.  But the FuncDefs for built-in functions are read-only.
  ** So we must not search for built-ins when creating a new function.
  */ 
  if( !createFlag && (pBest==0 || (db->flags & SQLITE_PreferBuiltin)!=0) ){
    FuncDefHash *pHash = &GLOBAL(FuncDefHash, sqlite3GlobalFunctions);
    bestScore = 0;
    p = functionSearch(pHash, h, zName, nName);
    while( p ){
      int score = matchQuality(p, nArg, enc);
      if( score>bestScore ){
        pBest = p;
        bestScore = score;
      }
      p = p->pNext;
    }
  }

  /* If the createFlag parameter is true and the search did not reveal an
  ** exact match for the name, number of arguments and encoding, then add a
  ** new entry to the hash table and return it.
  */
  if( createFlag && bestScore<FUNC_PERFECT_MATCH && 
      (pBest = sqlite3DbMallocZero(db, sizeof(*pBest)+nName+1))!=0 ){
    pBest->zName = (char *)&pBest[1];
    pBest->nArg = (u16)nArg;
    pBest->iPrefEnc = enc;
    memcpy(pBest->zName, zName, nName);
    pBest->zName[nName] = 0;
    sqlite3FuncDefInsert(&db->aFunc, pBest);
  }

  if( pBest && (pBest->xStep || pBest->xFunc || createFlag) ){
    return pBest;
  }
  return 0;
}